

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

void lj_tab_free(global_State *g,GCtab *t)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  size_t sVar4;
  GCtab *t_local;
  global_State *g_local;
  
  if (t->hmask != 0) {
    pvVar2 = (void *)(t->node).ptr64;
    uVar3 = (ulong)(t->hmask + 1);
    (g->gc).total = (g->gc).total + uVar3 * -0x18;
    (*g->allocf)(g->allocd,pvVar2,uVar3 * 0x18,0);
  }
  if ((t->asize != 0) && (t->colo < '\x01')) {
    pvVar2 = (void *)(t->array).ptr64;
    uVar1 = t->asize;
    (g->gc).total = (g->gc).total + (ulong)uVar1 * -8;
    (*g->allocf)(g->allocd,pvVar2,(ulong)uVar1 * 8,0);
  }
  if (t->colo == '\0') {
    (g->gc).total = (g->gc).total - 0x40;
    (*g->allocf)(g->allocd,t,0x40,0);
  }
  else {
    sVar4 = (ulong)((int)t->colo & 0x7f) * 8 + 0x40;
    (g->gc).total = (g->gc).total - sVar4;
    (*g->allocf)(g->allocd,t,sVar4,0);
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_tab_free(global_State *g, GCtab *t)
{
  if (t->hmask > 0)
    lj_mem_freevec(g, noderef(t->node), t->hmask+1, Node);
  if (t->asize > 0 && LJ_MAX_COLOSIZE != 0 && t->colo <= 0)
    lj_mem_freevec(g, tvref(t->array), t->asize, TValue);
  if (LJ_MAX_COLOSIZE != 0 && t->colo)
    lj_mem_free(g, t, sizetabcolo((uint32_t)t->colo & 0x7f));
  else
    lj_mem_freet(g, t);
}